

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::init
          (SampleMaskCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *log;
  char *pcVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  size_type sVar5;
  int iVar6;
  deUint32 dVar7;
  ContextType type;
  GLSLVersion version;
  undefined4 uVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar9;
  undefined4 extraout_var_00;
  char *__s;
  mapped_type *pmVar10;
  ShaderProgram *pSVar11;
  pointer pcVar12;
  undefined4 extraout_var_01;
  long *plVar13;
  TestError *pTVar14;
  NotSupportedError *pNVar15;
  size_type *psVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  size_type __dnew_1;
  GLint maxSamples;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  GLint maxSampleMaskWords;
  ScopedLogSection section;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridData;
  size_type __dnew_3;
  undefined1 local_2d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  int local_2ac;
  string local_2a8;
  undefined1 local_288 [8];
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_270;
  size_t local_260;
  int local_254;
  undefined1 local_250 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  ShaderProgram *local_228;
  ScopedLogSection local_220;
  string local_218;
  undefined1 local_1f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [6];
  ios_base local_188 [8];
  ios_base local_180 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_168;
  undefined1 local_148 [208];
  size_type local_78;
  string local_70;
  StringTemplate local_50;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar6);
  local_2ac = 0;
  local_254 = 0;
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (this->m_maxSampleMaskWords <= pRVar9->m_width) {
    pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (this->m_maxSampleMaskWords <= pRVar9->m_height) {
      (**(code **)(lVar20 + 0x868))(0x8e59,&local_254);
      if (local_254 <
          *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4))
      {
        pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Test requires larger GL_MAX_SAMPLE_MASK_WORDS","");
        tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_1f8);
        __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar20 + 0x868))(0x910e,&local_2ac);
      if (local_2ac < (int)this->m_verifierType) {
        pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,
                   "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES","");
        tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_1f8);
        __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      local_1f8 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f0,"GL_MAX_COLOR_TEXTURE_SAMPLES = ",0x1f);
      std::ostream::operator<<((ostringstream *)&local_1f0,local_2ac);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      if ((((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) != 0) &&
         ((this->m_verifierType & QUERY_POINTER) == QUERY_BOOLEAN)) {
        local_1f8 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f0,
                   "Sample count is multiple of word size. No unused high bits in sample mask.\nSkipping."
                   ,0x54);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
        std::ios_base::~ios_base(local_180);
        pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,
                   "Test requires unused high bits (sample count not multiple of 32)","");
        tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_1f8);
        __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      local_1f8 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f0,"Creating multisample texture with sample count ",0x2f);
      std::ostream::operator<<((ostringstream *)&local_1f0,this->m_verifierType);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      (**(code **)(lVar20 + 0x6f8))
                (1,(undefined1 *)
                   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
                           _M_p + 4));
      (**(code **)(lVar20 + 0xb8))
                (0x9100,*(undefined4 *)
                         ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                                 _M_dataplus._M_p + 4));
      (**(code **)(lVar20 + 0x1390))
                (0x9100,this->m_verifierType,0x8058,this->m_maxSampleMaskWords,
                 this->m_maxSampleMaskWords,0);
      dVar7 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar7,"texStorage2DMultisample",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x28e);
      local_1f8 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f0,"Attaching texture to FBO",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      (**(code **)(lVar20 + 0x6d0))
                (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
      (**(code **)(lVar20 + 0x78))
                (0x8d40,*(undefined4 *)
                         &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
      (**(code **)(lVar20 + 0x6a0))
                (0x8d40,0x8ce0,0x9100,
                 *(undefined4 *)
                  ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
                          _M_p + 4),0);
      dVar7 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar7,"framebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x297);
      (**(code **)(lVar20 + 0x708))
                (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
      dVar7 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar7,"genVertexArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x29c);
      (**(code **)(lVar20 + 0x6c8))
                (1,(undefined1 *)
                   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                           _M_string_length + 4));
      (**(code **)(lVar20 + 0x40))
                (0x8892,*(undefined4 *)
                         ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                                 _M_string_length + 4));
      dVar7 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar7,"genBuffers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x2a0);
      iVar6 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1f8
                 ,(long)(iVar6 * iVar6 * 6),(allocator_type *)local_288);
      if (0 < *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode) {
        iVar6 = 0;
        do {
          iVar19 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          if (0 < iVar19) {
            fVar21 = (float)iVar6;
            fVar22 = (float)(iVar6 + 1);
            iVar17 = 0;
            do {
              fVar23 = (float)iVar17;
              fVar24 = fVar23 / (float)iVar19;
              fVar25 = fVar21 / (float)iVar19;
              lVar18 = (long)((iVar19 * iVar6 + iVar17) * 6) * 0x10;
              *(float *)((long)local_1f8 + lVar18) = fVar24 + fVar24 + -1.0;
              *(float *)((long)local_1f8 + lVar18 + 4) = fVar25 + fVar25 + -1.0;
              pcVar12 = (pointer)((long)local_1f8 + lVar18 + 8);
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = -0x80;
              pcVar12[7] = '?';
              iVar19 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
              fVar24 = (float)iVar19;
              fVar25 = fVar23 / fVar24;
              fVar24 = fVar22 / fVar24;
              lVar18 = (long)((iVar19 * iVar6 + iVar17) * 6 + 1) * 0x10;
              *(float *)((long)local_1f8 + lVar18) = fVar25 + fVar25 + -1.0;
              *(float *)((long)local_1f8 + lVar18 + 4) = fVar24 + fVar24 + -1.0;
              pcVar12 = (pointer)((long)local_1f8 + lVar18 + 8);
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = -0x80;
              pcVar12[7] = '?';
              iVar1 = iVar17 + 1;
              fVar24 = (float)iVar1;
              iVar19 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
              fVar25 = (float)iVar19;
              fVar26 = fVar24 / fVar25;
              fVar25 = fVar22 / fVar25;
              lVar18 = (long)((iVar19 * iVar6 + iVar17) * 6 + 2) * 0x10;
              *(float *)((long)local_1f8 + lVar18) = fVar26 + fVar26 + -1.0;
              *(float *)((long)local_1f8 + lVar18 + 4) = fVar25 + fVar25 + -1.0;
              pcVar12 = (pointer)((long)local_1f8 + lVar18 + 8);
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = -0x80;
              pcVar12[7] = '?';
              iVar19 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
              fVar25 = (float)iVar19;
              fVar23 = fVar23 / fVar25;
              fVar25 = fVar21 / fVar25;
              lVar18 = (long)((iVar19 * iVar6 + iVar17) * 6 + 3) * 0x10;
              *(float *)((long)local_1f8 + lVar18) = fVar23 + fVar23 + -1.0;
              *(float *)((long)local_1f8 + lVar18 + 4) = fVar25 + fVar25 + -1.0;
              pcVar12 = (pointer)((long)local_1f8 + lVar18 + 8);
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = -0x80;
              pcVar12[7] = '?';
              iVar19 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
              fVar23 = (float)iVar19;
              fVar25 = fVar24 / fVar23;
              fVar23 = fVar22 / fVar23;
              lVar18 = (long)((iVar19 * iVar6 + iVar17) * 6 + 4) * 0x10;
              *(float *)((long)local_1f8 + lVar18) = fVar25 + fVar25 + -1.0;
              *(float *)((long)local_1f8 + lVar18 + 4) = fVar23 + fVar23 + -1.0;
              pcVar12 = (pointer)((long)local_1f8 + lVar18 + 8);
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = -0x80;
              pcVar12[7] = '?';
              iVar19 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
              fVar23 = (float)iVar19;
              fVar24 = fVar24 / fVar23;
              fVar23 = fVar21 / fVar23;
              lVar18 = (long)((iVar19 * iVar6 + iVar17) * 6 + 5) * 0x10;
              *(float *)((long)local_1f8 + lVar18) = fVar24 + fVar24 + -1.0;
              *(float *)((long)local_1f8 + lVar18 + 4) = fVar23 + fVar23 + -1.0;
              pcVar12 = (pointer)((long)local_1f8 + lVar18 + 8);
              pcVar12[0] = '\0';
              pcVar12[1] = '\0';
              pcVar12[2] = '\0';
              pcVar12[3] = '\0';
              pcVar12[4] = '\0';
              pcVar12[5] = '\0';
              pcVar12[6] = -0x80;
              pcVar12[7] = '?';
              iVar19 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
              iVar17 = iVar1;
            } while (iVar1 < iVar19);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                  _vptr_TestNode);
      }
      (**(code **)(lVar20 + 0x150))
                (0x8892,(long)((int)local_1f0 - local_1f8._0_4_) & 0xfffffffffffffff0,local_1f8,
                 0x88e4);
      dVar7 = (**(code **)(lVar20 + 0x800))();
      glu::checkError(dVar7,"bufferData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x2b2);
      if (local_1f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1f8,local_1e8[0]._M_allocated_capacity - (long)local_1f8);
      }
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_288 = (undefined1  [8])0x15;
      local_1f8 = (undefined1  [8])local_1e8;
      local_1f8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_288);
      local_1e8[0]._M_allocated_capacity = local_288;
      *(undefined8 *)local_1f8 = 0x65746172656e6547;
      builtin_strncpy((char *)((long)local_1f8 + 8),"SamplerS",8);
      builtin_strncpy((char *)((long)local_1f8 + 0xd),"erShader",8);
      local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288;
      *(char *)((long)local_1f8 + (long)local_288) = '\0';
      local_2d8._0_8_ = (pointer)0x17;
      local_288 = (undefined1  [8])(local_280 + 8);
      local_288 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_288,(ulong)local_2d8);
      local_280._8_8_ = local_2d8._0_8_;
      builtin_strncpy((char *)local_288,"Generate sampler shader",0x17);
      local_280._0_8_ = local_2d8._0_8_;
      *(char *)((long)local_288 + local_2d8._0_8_) = '\0';
      tcu::ScopedLogSection::ScopedLogSection
                (&local_220,log,(string *)local_1f8,(string *)local_288);
      if (local_288 != (undefined1  [8])(local_280 + 8)) {
        operator_delete((void *)local_288,(ulong)(local_280._8_8_ + 1));
      }
      if (local_1f8 != (undefined1  [8])local_1e8) {
        operator_delete((void *)local_1f8,(ulong)(local_1e8[0]._M_allocated_capacity + 1));
      }
      iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar20 = CONCAT44(extraout_var_00,iVar6);
      aStack_270._M_allocated_capacity = (size_type)local_280;
      local_280._0_8_ = local_280._0_8_ & 0xffffffff00000000;
      local_280._8_8_ = 0;
      local_260 = 0;
      aStack_270._8_8_ = aStack_270._M_allocated_capacity;
      type.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      version = glu::getContextTypeGLSLVersion(type);
      __s = glu::getGLSLVersionDeclaration(version);
      local_2d8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x11;
      local_1f8 = (undefined1  [8])local_1e8;
      local_1f8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_2d8);
      local_1e8[0]._M_allocated_capacity = local_2d8._0_8_;
      *(undefined8 *)local_1f8 = 0x5245565f4c534c47;
      builtin_strncpy((char *)((long)local_1f8 + 8),"SION_DEC",8);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_1f8 + 0x10))->_M_local_buf[0] = 'L';
      local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._0_8_;
      *(char *)((long)local_1f8 + local_2d8._0_8_) = '\0';
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_288,(key_type *)local_1f8);
      pcVar2 = (char *)pmVar10->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar2,(ulong)__s);
      if (local_1f8 != (undefined1  [8])local_1e8) {
        operator_delete((void *)local_1f8,local_1e8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::ostream::operator<<(local_1f8,this->m_verifierType);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
      std::ios_base::~ios_base(local_188);
      local_1e8[0]._M_allocated_capacity = (pointer)0x4c504d41534d554e;
      local_1e8[0]._8_2_ = 0x5345;
      local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0xa;
      local_1e8[0]._M_local_buf[10] = '\0';
      local_1f8 = (undefined1  [8])local_1e8;
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_288,(key_type *)local_1f8);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)local_2d8);
      if (local_1f8 != (undefined1  [8])local_1e8) {
        operator_delete((void *)local_1f8,(ulong)(local_1e8[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._0_8_ != &local_2c8) {
        operator_delete((void *)local_2d8._0_8_,local_2c8._M_allocated_capacity + 1);
      }
      pSVar11 = (ShaderProgram *)operator_new(0xd0);
      pCVar3 = (this->super_TestCase).m_context;
      pRVar4 = pCVar3->m_renderCtx;
      local_148[0x10] = 0;
      local_148._17_8_ = 0;
      local_148._0_8_ = (pointer)0x0;
      local_148[8] = 0;
      local_148._9_7_ = 0;
      memset(local_1f8,0,0xac);
      local_228 = pSVar11;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2a8,(_anonymous_namespace_ *)pCVar3,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,__s);
      local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
      local_2d8._8_8_ = local_2c8._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_2d8 + 8),local_2a8._M_dataplus._M_p,
                 local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1f8 + (local_2d8._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_2d8 + 8));
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_78 = 0x27a;
      pcVar12 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_78);
      sVar5 = local_78;
      local_218.field_2._M_allocated_capacity = local_78;
      local_218._M_dataplus._M_p = pcVar12;
      memcpy(pcVar12,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp sampler2DMS u_sampler;\nuniform highp int u_sample;\nvoid main (void)\n{\n\thighp float correctCoverage = 0.0;\n\thighp float incorrectCoverage = 0.0;\n\thighp ivec2 texelPos = ivec2(int(floor(gl_FragCoord.x)), int(floor(gl_FragCoord.y)));\n\n\tfor (int sampleNdx = 0; sampleNdx < ${NUMSAMPLES}; ++sampleNdx)\n\t{\n\t\thighp float sampleColor = texelFetch(u_sampler, texelPos, sampleNdx).r;\n\t\tif (sampleNdx == u_sample)\n\t\t\tcorrectCoverage += sampleColor;\n\t\telse\n\t\t\tincorrectCoverage += sampleColor;\n\t}\n\tfragColor = vec4(correctCoverage, incorrectCoverage, 0.0, 1.0);\n}\n"
             ,0x27a);
      local_218._M_string_length = sVar5;
      pcVar12[sVar5] = '\0';
      tcu::StringTemplate::StringTemplate(&local_50,&local_218);
      tcu::StringTemplate::specialize
                (&local_70,&local_50,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_288);
      local_250._0_4_ = 1;
      local_250._8_8_ = local_240._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_250 + 8),local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      pSVar11 = local_228;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1f8 + (ulong)(uint)local_250._0_4_ * 0x18),(value_type *)(local_250 + 8)
                 );
      glu::ShaderProgram::ShaderProgram(pSVar11,pRVar4,(ProgramSources *)local_1f8);
      *(ShaderProgram **)
       ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = pSVar11;
      if ((char *)local_250._8_8_ != local_240._M_local_buf + 8) {
        operator_delete((void *)local_250._8_8_,local_240._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      tcu::StringTemplate::~StringTemplate(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_2d8._8_8_ != local_2c8._M_local_buf + 8) {
        operator_delete((void *)local_2d8._8_8_,local_2c8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_168);
      lVar18 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1f8 + lVar18));
        lVar18 = lVar18 + -0x18;
      } while (lVar18 != -0x18);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      *(ShaderProgram **)
                       ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 +
                       8));
      lVar18 = *(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2
                        + 8);
      if (*(char *)(lVar18 + 0xc0) != '\0') {
        uVar8 = (**(code **)(lVar20 + 0x780))(*(undefined4 *)(lVar18 + 0x98),"a_position");
        *(undefined4 *)
         &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p =
             uVar8;
        uVar8 = (**(code **)(lVar20 + 0xb48))
                          (*(undefined4 *)
                            (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                              m_name.field_2 + 8) + 0x98),"u_sampler");
        *(undefined4 *)
         ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p
         + 4) = uVar8;
        uVar8 = (**(code **)(lVar20 + 0xb48))
                          (*(undefined4 *)
                            (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                              m_name.field_2 + 8) + 0x98));
        *(undefined4 *)
         &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length =
             uVar8;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_288);
        tcu::TestLog::endSection(local_220.m_log);
        iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        pSVar11 = (ShaderProgram *)operator_new(0xd0);
        pCVar3 = (this->super_TestCase).m_context;
        pRVar4 = pCVar3->m_renderCtx;
        local_148[0x10] = 0;
        local_148._17_8_ = 0;
        local_148._0_8_ = (pointer)0x0;
        local_148[8] = 0;
        local_148._9_7_ = 0;
        memset(local_1f8,0,0xac);
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  ((string *)local_250,(_anonymous_namespace_ *)pCVar3,
                   (Context *)
                   "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp float v_alpha;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_alpha = (a_position.x * 0.5 + 0.5)*(a_position.y * 0.5 + 0.5);\n}\n"
                   ,__s);
        local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
        local_280._0_8_ = &aStack_270;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_280,CONCAT44(local_250._4_4_,local_250._0_4_),
                   (char *)(local_250._8_8_ + CONCAT44(local_250._4_4_,local_250._0_4_)));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1f8 + ((ulong)local_288 & 0xffffffff) * 0x18),(value_type *)local_280)
        ;
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2a8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                   (Context *)
                   "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nin mediump float v_alpha;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, v_alpha);\n}\n"
                   ,__s);
        local_2d8._0_4_ = 1;
        local_2d8._8_8_ = local_2c8._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_2d8 + 8),local_2a8._M_dataplus._M_p,
                   local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1f8 + (local_2d8._0_8_ & 0xffffffff) * 0x18),
                    (value_type *)(local_2d8 + 8));
        glu::ShaderProgram::ShaderProgram(pSVar11,pRVar4,(ProgramSources *)local_1f8);
        *(ShaderProgram **)
         &this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 = pSVar11;
        if ((char *)local_2d8._8_8_ != local_2c8._M_local_buf + 8) {
          operator_delete((void *)local_2d8._8_8_,local_2c8._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ != &aStack_270) {
          operator_delete((void *)local_280._0_8_,(ulong)(aStack_270._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_250._4_4_,local_250._0_4_) != &local_240) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_250._4_4_,local_250._0_4_),
                          local_240._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_148);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&local_168);
        lVar20 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1f8 + lVar20));
          lVar20 = lVar20 + -0x18;
        } while (lVar20 != -0x18);
        pSVar11 = (ShaderProgram *)
                  this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
                  _M_allocated_capacity;
        if ((pSVar11->m_program).m_info.linkOk != false) {
          iVar6 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x780))
                            ((pSVar11->m_program).m_program,"a_position");
          *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2
                  + 8) = iVar6;
          return iVar6;
        }
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        local_1f8 = (undefined1  [8])local_1e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"Could not create aplha program.","");
        tcu::TestError::TestError(pTVar14,(string *)local_1f8);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      local_1f8 = (undefined1  [8])local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"Could not create sampler program.","");
      tcu::TestError::TestError(pTVar14,(string *)local_1f8);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pNVar15 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>((string *)local_250,&this->m_maxSampleMaskWords);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 "render target size must be at least ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  plVar13 = (long *)std::__cxx11::string::append(local_2d8);
  local_288 = (undefined1  [8])*plVar13;
  psVar16 = (size_type *)(plVar13 + 2);
  if (local_288 == (undefined1  [8])psVar16) {
    local_280._8_8_ = *psVar16;
    aStack_270._M_allocated_capacity = plVar13[3];
    local_288 = (undefined1  [8])(local_280 + 8);
  }
  else {
    local_280._8_8_ = *psVar16;
  }
  local_280._0_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  de::toString<int>(&local_2a8,&this->m_maxSampleMaskWords);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 &local_2a8);
  tcu::NotSupportedError::NotSupportedError(pNVar15,(string *)local_1f8);
  __cxa_throw(pNVar15,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SampleMaskCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	glw::GLint				maxSamples			= 0;
	glw::GLint				maxSampleMaskWords	= 0;

	// requirements

	if (m_context.getRenderTarget().getWidth() < m_canvasSize || m_context.getRenderTarget().getHeight() < m_canvasSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(m_canvasSize) + "x" + de::toString(m_canvasSize));

	gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &maxSampleMaskWords);
	if (m_effectiveSampleMaskWordCount > maxSampleMaskWords)
		throw tcu::NotSupportedError("Test requires larger GL_MAX_SAMPLE_MASK_WORDS");

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &maxSamples);
	if (m_samples > maxSamples)
		throw tcu::NotSupportedError("Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_COLOR_TEXTURE_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;

	// Don't even try to test high bits if there are none

	if ((m_flags & FLAGS_HIGH_BITS) && (m_samples % 32 == 0))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Sample count is multiple of word size. No unused high bits in sample mask.\nSkipping." << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("Test requires unused high bits (sample count not multiple of 32)");
	}

	// generate textures

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample texture with sample count " << m_samples << tcu::TestLog::EndMessage;

	gl.genTextures				(1, &m_texID);
	gl.bindTexture				(GL_TEXTURE_2D_MULTISAMPLE, m_texID);
	gl.texStorage2DMultisample	(GL_TEXTURE_2D_MULTISAMPLE, m_samples, GL_RGBA8, m_canvasSize, m_canvasSize, GL_FALSE);
	GLU_EXPECT_NO_ERROR			(gl.getError(), "texStorage2DMultisample");

	// attach texture to fbo

	m_testCtx.getLog() << tcu::TestLog::Message << "Attaching texture to FBO" << tcu::TestLog::EndMessage;

	gl.genFramebuffers		(1, &m_fboID);
	gl.bindFramebuffer		(GL_FRAMEBUFFER, m_fboID);
	gl.framebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, m_texID, 0);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "framebufferTexture2D");

	// buffers

	gl.genVertexArrays		(1, &m_vaoID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "genVertexArrays");

	gl.genBuffers			(1, &m_vboID);
	gl.bindBuffer			(GL_ARRAY_BUFFER, m_vboID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "genBuffers");

	// generate grid pattern
	{
		std::vector<tcu::Vec4> gridData(m_gridsize*m_gridsize*6);

		for (int y = 0; y < m_gridsize; ++y)
		for (int x = 0; x < m_gridsize; ++x)
		{
			gridData[(y * m_gridsize + x)*6 + 0] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 1] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 2] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 3] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 4] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 5] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
		}

		gl.bufferData			(GL_ARRAY_BUFFER, (int)(gridData.size() * sizeof(tcu::Vec4)), gridData[0].getPtr(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR		(gl.getError(), "bufferData");
	}

	// generate programs

	genSamplerProgram();
	genAlphaProgram();
}